

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int r1fgkb_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  int ipph;
  int idij;
  int ipp2;
  int idp2;
  double ar2h;
  double ar1h;
  double tpi;
  double dsp;
  double arg;
  double dcp;
  int nbd;
  double ds2;
  double ar2;
  double ar1;
  double ai2;
  double ai1;
  double dc2;
  int is;
  int ik;
  int lc;
  int jc;
  int ic;
  int j2;
  int l;
  int k;
  int j;
  int i__;
  int i__3;
  int i__2;
  int i__1;
  int ch2_offset;
  int ch2_dim2;
  int ch2_dim1;
  int c2_offset;
  int c2_dim2;
  int c2_dim1;
  int c1_offset;
  int c1_dim3;
  int c1_dim2;
  int c1_dim1;
  int cc_offset;
  int cc_dim3;
  int cc_dim2;
  int cc_dim1;
  int ch_offset;
  int ch_dim3;
  int ch_dim2;
  int ch_dim1;
  undefined4 local_12c;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  
  lVar21 = (long)dsp + -8;
  iVar1 = *_ipp2;
  iVar2 = *in_RCX;
  lVar22 = _ipph + (long)(iVar1 * (iVar2 + 1) + 1) * -8;
  iVar3 = *_ipp2;
  iVar4 = *in_RDI;
  iVar5 = *in_RDX;
  lVar23 = in_R9 + (long)(iVar3 * (iVar4 * (iVar5 + 1) + 1) + 1) * -8;
  iVar6 = *_ipp2;
  iVar20 = *in_RDI;
  iVar7 = *in_RSI;
  lVar24 = in_R8 + (long)(iVar6 * (iVar20 * (iVar7 + 1) + 1) + 1) * -8;
  iVar8 = *(int *)tpi;
  iVar9 = *in_RCX;
  lVar25 = (long)ar1h + (long)(iVar8 * (iVar9 + 1) + 1) * -8;
  iVar10 = *(int *)tpi;
  iVar11 = *in_RDI;
  iVar12 = *in_RDX;
  lVar26 = (long)ar2h + (long)(iVar10 * (iVar11 * (iVar12 + 1) + 1) + 1) * -8;
  dVar27 = atan(1.0);
  dVar27 = (dVar27 * 8.0) / (double)*in_RSI;
  dVar28 = cos(dVar27);
  dVar27 = sin(dVar27);
  iVar13 = *in_RDI;
  iVar16 = (*in_RDI + -1) / 2;
  iVar17 = *in_RSI + 2;
  iVar18 = (*in_RSI + 1) / 2;
  if (*in_RDI < *in_RDX) {
    iVar14 = *in_RDI;
    for (local_90 = 1; local_90 <= iVar14; local_90 = local_90 + 1) {
      iVar15 = *in_RDX;
      for (local_98 = 1; local_98 <= iVar15; local_98 = local_98 + 1) {
        *(undefined8 *)(lVar26 + (long)((local_90 + (local_98 + iVar12) * iVar11) * iVar10 + 1) * 8)
             = *(undefined8 *)
                (lVar24 + (long)((local_90 + (local_98 * iVar7 + 1) * iVar20) * iVar6 + 1) * 8);
      }
    }
  }
  else {
    iVar14 = *in_RDX;
    for (local_98 = 1; local_98 <= iVar14; local_98 = local_98 + 1) {
      iVar15 = *in_RDI;
      for (local_90 = 1; local_90 <= iVar15; local_90 = local_90 + 1) {
        *(undefined8 *)(lVar26 + (long)((local_90 + (local_98 + iVar12) * iVar11) * iVar10 + 1) * 8)
             = *(undefined8 *)
                (lVar24 + (long)((local_90 + (local_98 * iVar7 + 1) * iVar20) * iVar6 + 1) * 8);
      }
    }
  }
  for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
    iVar15 = local_94 * 2;
    iVar14 = *in_RDX;
    for (local_98 = 1; local_98 <= iVar14; local_98 = local_98 + 1) {
      *(double *)(lVar26 + (long)(((local_98 + local_94 * iVar12) * iVar11 + 1) * iVar10 + 1) * 8) =
           *(double *)
            (lVar24 + (long)((*in_RDI + (iVar15 + -2 + local_98 * iVar7) * iVar20) * iVar6 + 1) * 8)
           + *(double *)
              (lVar24 + (long)((*in_RDI + (iVar15 + -2 + local_98 * iVar7) * iVar20) * iVar6 + 1) *
                        8);
      *(double *)
       (lVar26 + (long)(((local_98 + (iVar17 - local_94) * iVar12) * iVar11 + 1) * iVar10 + 1) * 8)
           = *(double *)
              (lVar24 + (long)(((iVar15 + -1 + local_98 * iVar7) * iVar20 + 1) * iVar6 + 1) * 8) +
             *(double *)
              (lVar24 + (long)(((iVar15 + -1 + local_98 * iVar7) * iVar20 + 1) * iVar6 + 1) * 8);
    }
  }
  if (*in_RDI != 1) {
    if (iVar16 < *in_RDX) {
      for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
        iVar14 = *in_RDI;
        for (local_90 = 3; local_90 <= iVar14; local_90 = local_90 + 2) {
          iVar19 = (iVar13 + 2) - local_90;
          iVar15 = *in_RDX;
          for (local_98 = 1; local_98 <= iVar15; local_98 = local_98 + 1) {
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1
                             ) * 8) =
                 *(double *)
                  (lVar24 + (long)((local_90 + -1 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20)
                                   * iVar6 + 1) * 8) +
                 *(double *)
                  (lVar24 + (long)((iVar19 + -1 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + (iVar17 - local_94) * iVar12) * iVar11) *
                              iVar10 + 1) * 8) =
                 *(double *)
                  (lVar24 + (long)((local_90 + -1 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20)
                                   * iVar6 + 1) * 8) -
                 *(double *)
                  (lVar24 + (long)((iVar19 + -1 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1) * 8
             ) = *(double *)
                  (lVar24 + (long)((local_90 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8) -
                 *(double *)
                  (lVar24 + (long)((iVar19 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + (iVar17 - local_94) * iVar12) * iVar11) *
                              iVar10 + 1) * 8) =
                 *(double *)
                  (lVar24 + (long)((local_90 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8) +
                 *(double *)
                  (lVar24 + (long)((iVar19 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
          }
        }
      }
    }
    else {
      for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
        iVar14 = *in_RDX;
        for (local_98 = 1; local_98 <= iVar14; local_98 = local_98 + 1) {
          iVar15 = *in_RDI;
          for (local_90 = 3; local_90 <= iVar15; local_90 = local_90 + 2) {
            iVar19 = (iVar13 + 2) - local_90;
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1
                             ) * 8) =
                 *(double *)
                  (lVar24 + (long)((local_90 + -1 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20)
                                   * iVar6 + 1) * 8) +
                 *(double *)
                  (lVar24 + (long)((iVar19 + -1 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + (iVar17 - local_94) * iVar12) * iVar11) *
                              iVar10 + 1) * 8) =
                 *(double *)
                  (lVar24 + (long)((local_90 + -1 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20)
                                   * iVar6 + 1) * 8) -
                 *(double *)
                  (lVar24 + (long)((iVar19 + -1 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1) * 8
             ) = *(double *)
                  (lVar24 + (long)((local_90 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8) -
                 *(double *)
                  (lVar24 + (long)((iVar19 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + (iVar17 - local_94) * iVar12) * iVar11) *
                              iVar10 + 1) * 8) =
                 *(double *)
                  (lVar24 + (long)((local_90 + (local_94 * 2 + -1 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8) +
                 *(double *)
                  (lVar24 + (long)((iVar19 + (local_94 * 2 + -2 + local_98 * iVar7) * iVar20) *
                                   iVar6 + 1) * 8);
          }
        }
      }
    }
  }
  local_d8 = 1.0;
  local_c8 = 0.0;
  for (local_9c = 2; local_9c <= iVar18; local_9c = local_9c + 1) {
    dVar29 = dVar28 * local_d8 + -(dVar27 * local_c8);
    local_c8 = dVar28 * local_c8 + dVar27 * local_d8;
    iVar6 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar6; local_b0 = local_b0 + 1) {
      *(double *)(lVar22 + (long)((local_b0 + local_9c * iVar2) * iVar1 + 1) * 8) =
           dVar29 * *(double *)(lVar25 + (long)((local_b0 + iVar9 * 2) * iVar8 + 1) * 8) +
           *(double *)(lVar25 + (long)((local_b0 + iVar9) * iVar8 + 1) * 8);
      *(double *)(lVar22 + (long)((local_b0 + (iVar17 - local_9c) * iVar2) * iVar1 + 1) * 8) =
           local_c8 * *(double *)(lVar25 + (long)((local_b0 + *in_RSI * iVar9) * iVar8 + 1) * 8);
    }
    local_e0 = dVar29;
    local_d0 = local_c8;
    for (local_94 = 3; local_94 <= iVar18; local_94 = local_94 + 1) {
      dVar30 = dVar29 * local_e0 + -(local_c8 * local_d0);
      local_d0 = dVar29 * local_d0 + local_c8 * local_e0;
      iVar6 = *in_RCX;
      for (local_b0 = 1; local_b0 <= iVar6; local_b0 = local_b0 + 1) {
        lVar24 = (long)((local_b0 + local_9c * iVar2) * iVar1 + 1);
        *(double *)(lVar22 + lVar24 * 8) =
             dVar30 * *(double *)(lVar25 + (long)((local_b0 + local_94 * iVar9) * iVar8 + 1) * 8) +
             *(double *)(lVar22 + lVar24 * 8);
        lVar24 = (long)((local_b0 + (iVar17 - local_9c) * iVar2) * iVar1 + 1);
        *(double *)(lVar22 + lVar24 * 8) =
             local_d0 *
             *(double *)(lVar25 + (long)((local_b0 + (iVar17 - local_94) * iVar9) * iVar8 + 1) * 8)
             + *(double *)(lVar22 + lVar24 * 8);
      }
      local_e0 = dVar30;
    }
    local_d8 = dVar29;
  }
  for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
    iVar6 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar6; local_b0 = local_b0 + 1) {
      lVar24 = (long)((local_b0 + iVar9) * iVar8 + 1);
      *(double *)(lVar25 + lVar24 * 8) =
           *(double *)(lVar25 + (long)((local_b0 + local_94 * iVar9) * iVar8 + 1) * 8) +
           *(double *)(lVar25 + lVar24 * 8);
    }
  }
  for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
    iVar20 = iVar17 - local_94;
    iVar6 = *in_RDX;
    for (local_98 = 1; local_98 <= iVar6; local_98 = local_98 + 1) {
      *(double *)(lVar26 + (long)(((local_98 + local_94 * iVar12) * iVar11 + 1) * iVar10 + 1) * 8) =
           *(double *)(lVar23 + (long)(((local_98 + local_94 * iVar5) * iVar4 + 1) * iVar3 + 1) * 8)
           - *(double *)(lVar23 + (long)(((local_98 + iVar20 * iVar5) * iVar4 + 1) * iVar3 + 1) * 8)
      ;
      *(double *)(lVar26 + (long)(((local_98 + iVar20 * iVar12) * iVar11 + 1) * iVar10 + 1) * 8) =
           *(double *)(lVar23 + (long)(((local_98 + local_94 * iVar5) * iVar4 + 1) * iVar3 + 1) * 8)
           + *(double *)(lVar23 + (long)(((local_98 + iVar20 * iVar5) * iVar4 + 1) * iVar3 + 1) * 8)
      ;
    }
  }
  if (*in_RDI != 1) {
    if (iVar16 < *in_RDX) {
      for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
        iVar20 = iVar17 - local_94;
        iVar6 = *in_RDI;
        for (local_90 = 3; local_90 <= iVar6; local_90 = local_90 + 2) {
          iVar7 = *in_RDX;
          for (local_98 = 1; local_98 <= iVar7; local_98 = local_98 + 1) {
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1
                             ) * 8) =
                 *(double *)
                  (lVar23 + (long)((local_90 + -1 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 +
                                  1) * 8) -
                 *(double *)
                  (lVar23 + (long)((local_90 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 + 1) * 8
                  );
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar12) * iVar11) * iVar10 + 1)
                       * 8) =
                 *(double *)
                  (lVar23 + (long)((local_90 + -1 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 +
                                  1) * 8) +
                 *(double *)
                  (lVar23 + (long)((local_90 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 + 1) * 8
                  );
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1) * 8
             ) = *(double *)
                  (lVar23 + (long)((local_90 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1) *
                            8) +
                 *(double *)
                  (lVar23 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 + 1
                                  ) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + iVar20 * iVar12) * iVar11) * iVar10 + 1) * 8)
                 = *(double *)
                    (lVar23 + (long)((local_90 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1)
                              * 8) -
                   *(double *)
                    (lVar23 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 +
                                    1) * 8);
          }
        }
      }
    }
    else {
      for (local_94 = 2; local_94 <= iVar18; local_94 = local_94 + 1) {
        iVar20 = iVar17 - local_94;
        iVar6 = *in_RDX;
        for (local_98 = 1; local_98 <= iVar6; local_98 = local_98 + 1) {
          iVar7 = *in_RDI;
          for (local_90 = 3; local_90 <= iVar7; local_90 = local_90 + 2) {
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1
                             ) * 8) =
                 *(double *)
                  (lVar23 + (long)((local_90 + -1 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 +
                                  1) * 8) -
                 *(double *)
                  (lVar23 + (long)((local_90 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 + 1) * 8
                  );
            *(double *)
             (lVar26 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar12) * iVar11) * iVar10 + 1)
                       * 8) =
                 *(double *)
                  (lVar23 + (long)((local_90 + -1 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 +
                                  1) * 8) +
                 *(double *)
                  (lVar23 + (long)((local_90 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 + 1) * 8
                  );
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1) * 8
             ) = *(double *)
                  (lVar23 + (long)((local_90 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1) *
                            8) +
                 *(double *)
                  (lVar23 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 + 1
                                  ) * 8);
            *(double *)
             (lVar26 + (long)((local_90 + (local_98 + iVar20 * iVar12) * iVar11) * iVar10 + 1) * 8)
                 = *(double *)
                    (lVar23 + (long)((local_90 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1)
                              * 8) -
                   *(double *)
                    (lVar23 + (long)((local_90 + -1 + (local_98 + iVar20 * iVar5) * iVar4) * iVar3 +
                                    1) * 8);
          }
        }
      }
    }
  }
  if (*in_RDI != 1) {
    iVar6 = *in_RCX;
    for (local_b0 = 1; local_b0 <= iVar6; local_b0 = local_b0 + 1) {
      *(undefined8 *)(lVar22 + (long)((local_b0 + iVar2) * iVar1 + 1) * 8) =
           *(undefined8 *)(lVar25 + (long)((local_b0 + iVar9) * iVar8 + 1) * 8);
    }
    iVar1 = *in_RSI;
    for (local_94 = 2; local_94 <= iVar1; local_94 = local_94 + 1) {
      iVar2 = *in_RDX;
      for (local_98 = 1; local_98 <= iVar2; local_98 = local_98 + 1) {
        *(undefined8 *)
         (lVar23 + (long)(((local_98 + local_94 * iVar5) * iVar4 + 1) * iVar3 + 1) * 8) =
             *(undefined8 *)
              (lVar26 + (long)(((local_98 + local_94 * iVar12) * iVar11 + 1) * iVar10 + 1) * 8);
      }
    }
    if (*in_RDX < iVar16) {
      local_b4 = -*in_RDI;
      iVar1 = *in_RSI;
      for (local_94 = 2; local_94 <= iVar1; local_94 = local_94 + 1) {
        local_b4 = *in_RDI + local_b4;
        iVar2 = *in_RDX;
        for (local_98 = 1; local_98 <= iVar2; local_98 = local_98 + 1) {
          iVar6 = *in_RDI;
          local_12c = local_b4;
          for (local_90 = 3; local_90 <= iVar6; local_90 = local_90 + 2) {
            iVar20 = local_12c + 2;
            *(double *)
             (lVar23 + (long)((local_90 + -1 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1) *
                       8) =
                 *(double *)(lVar21 + (long)(local_12c + 1) * 8) *
                 *(double *)
                  (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) *
                                   iVar10 + 1) * 8) +
                 -(*(double *)(lVar21 + (long)iVar20 * 8) *
                  *(double *)
                   (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 +
                                   1) * 8));
            *(double *)
             (lVar23 + (long)((local_90 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1) * 8) =
                 *(double *)(lVar21 + (long)(local_12c + 1) * 8) *
                 *(double *)
                  (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1
                                  ) * 8) +
                 *(double *)(lVar21 + (long)iVar20 * 8) *
                 *(double *)
                  (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) *
                                   iVar10 + 1) * 8);
            local_12c = iVar20;
          }
        }
      }
    }
    else {
      local_b4 = -*in_RDI;
      iVar1 = *in_RSI;
      for (local_94 = 2; local_94 <= iVar1; local_94 = local_94 + 1) {
        local_b4 = *in_RDI + local_b4;
        iVar2 = *in_RDI;
        local_12c = local_b4;
        for (local_90 = 3; local_90 <= iVar2; local_90 = local_90 + 2) {
          iVar20 = local_12c + 2;
          iVar6 = *in_RDX;
          for (local_98 = 1; local_98 <= iVar6; local_98 = local_98 + 1) {
            *(double *)
             (lVar23 + (long)((local_90 + -1 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1) *
                       8) =
                 *(double *)(lVar21 + (long)(local_12c + 1) * 8) *
                 *(double *)
                  (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) *
                                   iVar10 + 1) * 8) +
                 -(*(double *)(lVar21 + (long)iVar20 * 8) *
                  *(double *)
                   (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 +
                                   1) * 8));
            *(double *)
             (lVar23 + (long)((local_90 + (local_98 + local_94 * iVar5) * iVar4) * iVar3 + 1) * 8) =
                 *(double *)(lVar21 + (long)(local_12c + 1) * 8) *
                 *(double *)
                  (lVar26 + (long)((local_90 + (local_98 + local_94 * iVar12) * iVar11) * iVar10 + 1
                                  ) * 8) +
                 *(double *)(lVar21 + (long)iVar20 * 8) *
                 *(double *)
                  (lVar26 + (long)((local_90 + -1 + (local_98 + local_94 * iVar12) * iVar11) *
                                   iVar10 + 1) * 8);
          }
          local_12c = iVar20;
        }
      }
    }
  }
  return 0;
}

Assistant:

int r1fgkb_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    if (*ido < *l1) {
	goto L103;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L101: */
	}
/* L102: */
    }
    goto L106;
L103:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[(i__ + (k + ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k *
		     cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1];
/* L104: */
	}
/* L105: */
    }
L106:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[(*ido + (
		    j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] + cc[(*
		    ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((j2 -
		    1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((j2
		    - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1];
/* L1007: */
/* L107: */
	}
/* L108: */
    }
    if (*ido == 1) {
	goto L116;
    }
    if (nbd < *l1) {
	goto L112;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L109: */
	    }
/* L110: */
	}
/* L111: */
    }
    goto L116;
L112:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] + cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			cc[(i__ - 1 + ((j << 1) - 1 + k * cc_dim3) * cc_dim2)
			* cc_dim1 + 1] - cc[(ic - 1 + ((j << 1) - 2 + k *
			cc_dim3) * cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] - cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = cc[(
			i__ + ((j << 1) - 1 + k * cc_dim3) * cc_dim2) *
			cc_dim1 + 1] + cc[(ic + ((j << 1) - 2 + k * cc_dim3) *
			 cc_dim2) * cc_dim1 + 1];
/* L113: */
	    }
/* L114: */
	}
/* L115: */
    }
L116:
    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    c2[(ik + l * c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) *
		    ch2_dim1 + 1] + ar1 * ch2[(ik + (ch2_dim2 << 1)) *
		    ch2_dim1 + 1];
	    c2[(ik + lc * c2_dim2) * c2_dim1 + 1] = ai1 * ch2[(ik + *ip *
		    ch2_dim2) * ch2_dim1 + 1];
/* L117: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		c2[(ik + l * c2_dim2) * c2_dim1 + 1] += ar2 * ch2[(ik + j *
			ch2_dim2) * ch2_dim1 + 1];
		c2[(ik + lc * c2_dim2) * c2_dim1 + 1] += ai2 * ch2[(ik + jc *
			ch2_dim2) * ch2_dim1 + 1];
/* L118: */
	    }
/* L119: */
	}
/* L120: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += ch2[(ik + j * ch2_dim2) *
		    ch2_dim1 + 1];
/* L121: */
	}
/* L122: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] - c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
	    ch[((k + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j
		    * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] + c1[((k + jc *
		    c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L123: */
	}
/* L124: */
    }
    if (*ido == 1) {
	goto L132;
    }
    if (nbd < *l1) {
	goto L128;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    goto L132;
L128:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] - c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1
			+ 1] + c1[(i__ + (k + jc * c1_dim3) * c1_dim2) *
			c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] +
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
		ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1] = c1[(
			i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] -
			c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1
			+ 1];
/* L129: */
	    }
/* L130: */
	}
/* L131: */
    }
L132:
    if (*ido == 1) {
	return 0;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L133: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L134: */
	}
/* L135: */
    }
    if (nbd > *l1) {
	goto L139;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L136: */
	    }
/* L137: */
	}
/* L138: */
    }
    goto L143;
L139:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			wa[idij - 1] * ch[(i__ - 1 + (k + j * ch_dim3) *
			ch_dim2) * ch_dim1 + 1] - wa[idij] * ch[(i__ + (k + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = wa[
			idij - 1] * ch[(i__ + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + wa[idij] * ch[(i__ - 1 + (k + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L140: */
	    }
/* L141: */
	}
/* L142: */
    }
L143:
    return 0;
}